

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O3

anon_class_24_5_e9a28bf2 *
qclab::qgates::lambda_QGate1<float>
          (anon_class_24_5_e9a28bf2 *__return_storage_ptr__,Op op,SquareMatrix<float> *mat1,
          float *vector)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  
  if (mat1->size_ == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,mat1);
    pfVar3 = (mat1->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar1 = *(undefined8 *)pfVar3;
    uVar2 = *(undefined8 *)(pfVar3 + mat1->size_);
    __return_storage_ptr__->vector = vector;
    __return_storage_ptr__->m11 = (float)uVar1;
    __return_storage_ptr__->m12 = (float)uVar2;
    __return_storage_ptr__->m21 = (float)((ulong)uVar1 >> 0x20);
    __return_storage_ptr__->m22 = (float)((ulong)uVar2 >> 0x20);
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = float]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }